

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Deserializer.cpp
# Opt level: O3

void __thiscall
adios2::format::BP5Deserializer::InstallAttributesV1
          (BP5Deserializer *this,FFSTypeHandle FFSformat,void *BaseData,size_t Step)

{
  IO *pIVar1;
  complex<float> *array_00;
  uchar *array_01;
  double *array_02;
  int *array_03;
  unsigned_long *array_04;
  short *array_05;
  unsigned_short *array_06;
  uint *array_07;
  longdouble *array_08;
  float *array_09;
  undefined8 uVar2;
  int iVar3;
  DataType DVar4;
  undefined8 uVar5;
  long lVar6;
  long *plVar7;
  size_t sVar8;
  char *pcVar9;
  BP5Deserializer *__s;
  ostream *poVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  DataType type;
  uint uVar13;
  DataType type_00;
  char *pcVar14;
  BP5Deserializer *this_00;
  _Alloc_hider _Var15;
  complex<double> *pcVar16;
  pointer pcVar17;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar18;
  long lVar19;
  size_type sVar20;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  array;
  DataType Type;
  int ElemSize;
  string local_470;
  string local_450;
  BP5Deserializer *local_430;
  void *local_428;
  char *local_420;
  undefined1 local_418 [34];
  allocator local_3f6;
  allocator local_3f5;
  DataType local_3f4;
  long *local_3f0;
  ulong local_3e8;
  size_type local_3e0;
  int local_3d4;
  string local_3d0;
  string local_3b0;
  string local_390;
  string local_370;
  string local_350;
  string local_330;
  string local_310;
  string local_2f0;
  string local_2d0;
  string local_2b0;
  string local_290;
  string local_270;
  string local_250;
  string local_230;
  undefined1 local_210 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0;
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 local_60 [32];
  char local_40 [16];
  
  local_430 = this;
  if (this->m_LastAttrStep != Step) {
    core::IO::RemoveAllAttributes(this->m_Engine->m_IO);
    this->m_LastAttrStep = Step;
  }
  uVar5 = FMFormat_of_original(FFSformat);
  lVar6 = format_list_of_FMFormat(uVar5);
  plVar7 = *(long **)(lVar6 + 8);
  pcVar9 = (char *)*plVar7;
  if (pcVar9 != (char *)0x0) {
    local_3e8 = 0;
    local_428 = BaseData;
    local_3f0 = plVar7;
    do {
      paVar18 = &local_450.field_2;
      pcVar16 = (complex<double> *)((long)*(int *)((long)plVar7 + 0x14) + (long)BaseData);
      sVar8 = strlen(pcVar9);
      pcVar14 = "ElemCount";
      iVar3 = strcmp("ElemCount",pcVar9 + (sVar8 - 9));
      plVar7 = local_3f0;
      if (iVar3 != 0) {
        pcVar9 = BreakdownVarName((BP5Deserializer *)pcVar14,pcVar9,&local_3f4,&local_3d4);
        DVar4 = local_3f4;
        switch(local_3f4) {
        case Int8:
          pIVar1 = local_430->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_470,pcVar9,(allocator *)local_418);
          local_450._M_dataplus._M_p = (pointer)paVar18;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"");
          local_a0._16_8_ = local_80;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_a0 + 0x10),"/","");
          core::IO::DefineAttribute<signed_char>
                    (pIVar1,&local_470,(char *)pcVar16,&local_450,(string *)(local_a0 + 0x10),true);
          pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_80;
          uVar5 = local_a0._16_8_;
          break;
        case Int16:
          pIVar1 = local_430->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_470,pcVar9,(allocator *)local_418);
          local_450._M_dataplus._M_p = (pointer)paVar18;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"");
          local_c0._16_8_ = local_a0;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_c0 + 0x10),"/","");
          core::IO::DefineAttribute<short>
                    (pIVar1,&local_470,(short *)pcVar16,&local_450,(string *)(local_c0 + 0x10),true)
          ;
          pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a0;
          uVar5 = local_c0._16_8_;
          break;
        case Int32:
          pIVar1 = local_430->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_470,pcVar9,(allocator *)local_418);
          local_450._M_dataplus._M_p = (pointer)paVar18;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"");
          local_e0._16_8_ = local_c0;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_e0 + 0x10),"/","");
          core::IO::DefineAttribute<int>
                    (pIVar1,&local_470,(int *)pcVar16,&local_450,(string *)(local_e0 + 0x10),true);
          pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0;
          uVar5 = local_e0._16_8_;
          break;
        case Int64:
          pIVar1 = local_430->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_470,pcVar9,(allocator *)local_418);
          local_450._M_dataplus._M_p = (pointer)paVar18;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"");
          local_100._16_8_ = local_e0;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_100 + 0x10),"/","");
          core::IO::DefineAttribute<long>
                    (pIVar1,&local_470,(long *)pcVar16,&local_450,(string *)(local_100 + 0x10),true)
          ;
          pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0;
          uVar5 = local_100._16_8_;
          break;
        case UInt8:
          pIVar1 = local_430->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_470,pcVar9,(allocator *)local_418);
          local_450._M_dataplus._M_p = (pointer)paVar18;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"");
          local_120._16_8_ = local_100;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_120 + 0x10),"/","");
          core::IO::DefineAttribute<unsigned_char>
                    (pIVar1,&local_470,(uchar *)pcVar16,&local_450,(string *)(local_120 + 0x10),true
                    );
          pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100;
          uVar5 = local_120._16_8_;
          break;
        case UInt16:
          pIVar1 = local_430->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_470,pcVar9,(allocator *)local_418);
          local_450._M_dataplus._M_p = (pointer)paVar18;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"");
          local_140._16_8_ = local_120;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_140 + 0x10),"/","");
          core::IO::DefineAttribute<unsigned_short>
                    (pIVar1,&local_470,(unsigned_short *)pcVar16,&local_450,
                     (string *)(local_140 + 0x10),true);
          pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_120;
          uVar5 = local_140._16_8_;
          break;
        case UInt32:
          pIVar1 = local_430->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_470,pcVar9,(allocator *)local_418);
          local_450._M_dataplus._M_p = (pointer)paVar18;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"");
          local_160._16_8_ = local_140;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_160 + 0x10),"/","");
          core::IO::DefineAttribute<unsigned_int>
                    (pIVar1,&local_470,(uint *)pcVar16,&local_450,(string *)(local_160 + 0x10),true)
          ;
          pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140;
          uVar5 = local_160._16_8_;
          break;
        case UInt64:
          pIVar1 = local_430->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_470,pcVar9,(allocator *)local_418);
          local_450._M_dataplus._M_p = (pointer)paVar18;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"");
          local_180._16_8_ = local_160;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_180 + 0x10),"/","");
          core::IO::DefineAttribute<unsigned_long>
                    (pIVar1,&local_470,(unsigned_long *)pcVar16,&local_450,
                     (string *)(local_180 + 0x10),true);
          pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_160;
          uVar5 = local_180._16_8_;
          break;
        case Float:
          pIVar1 = local_430->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_470,pcVar9,(allocator *)local_418);
          local_450._M_dataplus._M_p = (pointer)paVar18;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"");
          local_1a0._16_8_ = local_180;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_1a0 + 0x10),"/","");
          core::IO::DefineAttribute<float>
                    (pIVar1,&local_470,(float *)pcVar16,&local_450,(string *)(local_1a0 + 0x10),true
                    );
          pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180;
          uVar5 = local_1a0._16_8_;
          break;
        case Double:
          pIVar1 = local_430->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_470,pcVar9,(allocator *)local_418);
          local_450._M_dataplus._M_p = (pointer)paVar18;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"");
          local_1c0._16_8_ = local_1a0;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_1c0 + 0x10),"/","");
          core::IO::DefineAttribute<double>
                    (pIVar1,&local_470,(double *)pcVar16,&local_450,(string *)(local_1c0 + 0x10),
                     true);
          pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a0;
          uVar5 = local_1c0._16_8_;
          break;
        case LongDouble:
          pIVar1 = local_430->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_470,pcVar9,(allocator *)local_418);
          local_450._M_dataplus._M_p = (pointer)paVar18;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"");
          local_1e0._16_8_ = local_1c0;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_1e0 + 0x10),"/","");
          core::IO::DefineAttribute<long_double>
                    (pIVar1,&local_470,(longdouble *)pcVar16,&local_450,(string *)(local_1e0 + 0x10)
                     ,true);
          pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c0;
          uVar5 = local_1e0._16_8_;
          break;
        case FloatComplex:
          pIVar1 = local_430->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_470,pcVar9,(allocator *)local_418);
          local_450._M_dataplus._M_p = (pointer)paVar18;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"");
          local_1f0._M_allocated_capacity = (size_type)local_1e0;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f0,"/","");
          core::IO::DefineAttribute<std::complex<float>>
                    (pIVar1,&local_470,(complex<float> *)pcVar16,&local_450,(string *)&local_1f0,
                     true);
          pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1e0;
          uVar5 = local_1f0._M_allocated_capacity;
          break;
        case DoubleComplex:
          pIVar1 = local_430->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_470,pcVar9,(allocator *)local_418);
          local_450._M_dataplus._M_p = (pointer)paVar18;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"");
          local_210._0_8_ = local_210 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_210,"/","");
          core::IO::DefineAttribute<std::complex<double>>
                    (pIVar1,&local_470,pcVar16,&local_450,(string *)local_210,true);
          pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_210 + 0x10);
          uVar5 = local_210._0_8_;
          break;
        case String:
          pIVar1 = local_430->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_470,pcVar9,&local_3f5);
          std::__cxx11::string::string((string *)&local_450,*(char **)pcVar16->_M_value,&local_3f6);
          local_418._0_8_ = local_418 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_418,"");
          local_60._16_8_ = local_40;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_60 + 0x10),"/","");
          core::IO::DefineAttribute<std::__cxx11::string>
                    (pIVar1,&local_470,&local_450,(string *)local_418,(string *)(local_60 + 0x10),
                     true);
          if ((char *)local_60._16_8_ != local_40) {
            operator_delete((void *)local_60._16_8_);
          }
          pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    (local_418 + 0x10);
          uVar5 = local_418._0_8_;
          break;
        case Char:
          pIVar1 = local_430->m_Engine->m_IO;
          std::__cxx11::string::string((string *)&local_470,pcVar9,(allocator *)local_418);
          local_450._M_dataplus._M_p = (pointer)paVar18;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"");
          local_80._16_8_ = local_60;
          std::__cxx11::string::_M_construct<char_const*>((string *)(local_80 + 0x10),"/","");
          core::IO::DefineAttribute<char>
                    (pIVar1,&local_470,(char *)pcVar16,&local_450,(string *)(local_80 + 0x10),true);
          pbVar11 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60;
          uVar5 = local_80._16_8_;
          break;
        case Struct:
          goto switchD_00610010_caseD_10;
        default:
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,"Loading attribute matched no type ",0x22);
          ToString_abi_cxx11_(&local_470,(adios2 *)(ulong)DVar4,type);
          poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&std::cout,local_470._M_dataplus._M_p,
                               local_470._M_string_length);
          std::endl<char,std::char_traits<char>>(poVar10);
          goto LAB_00610a79;
        }
        if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar5 != pbVar11) {
          operator_delete((void *)uVar5);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_450._M_dataplus._M_p != paVar18) {
          operator_delete(local_450._M_dataplus._M_p);
        }
LAB_00610a79:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_470._M_dataplus._M_p != &local_470.field_2) {
          operator_delete(local_470._M_dataplus._M_p);
        }
        uVar13 = (int)local_3e8 + 1;
        goto LAB_00611456;
      }
      sVar20 = *(size_type *)pcVar16->_M_value;
      lVar6 = (long)(int)local_3e8;
      local_420 = strdup((char *)((local_3f0 + 3)[lVar6 * 3] + 4));
      __s = (BP5Deserializer *)strdup((char *)(plVar7 + 4)[lVar6 * 3]);
      this_00 = __s;
      pcVar9 = strchr((char *)__s,0x5b);
      *pcVar9 = '\0';
      DVar4 = TranslateFFSType2ADIOS(this_00,(char *)__s,(int)(plVar7 + 5)[lVar6 * 3]);
      switch(DVar4) {
      case Int8:
        pcVar9 = *(char **)(pcVar16->_M_value + 8);
        pIVar1 = local_430->m_Engine->m_IO;
        std::__cxx11::string::string((string *)&local_470,local_420,(allocator *)local_418);
        local_450._M_dataplus._M_p = (pointer)paVar18;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"");
        BaseData = local_428;
        local_250._M_dataplus._M_p = (pointer)&local_250.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_250,"/","");
        core::IO::DefineAttribute<signed_char>
                  (pIVar1,&local_470,pcVar9,sVar20,&local_450,&local_250,true);
        paVar12 = &local_250.field_2;
        _Var15._M_p = local_250._M_dataplus._M_p;
        break;
      case Int16:
        array_05 = *(short **)(pcVar16->_M_value + 8);
        pIVar1 = local_430->m_Engine->m_IO;
        std::__cxx11::string::string((string *)&local_470,local_420,(allocator *)local_418);
        local_450._M_dataplus._M_p = (pointer)paVar18;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"");
        BaseData = local_428;
        local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_270,"/","");
        core::IO::DefineAttribute<short>
                  (pIVar1,&local_470,array_05,sVar20,&local_450,&local_270,true);
        paVar12 = &local_270.field_2;
        _Var15._M_p = local_270._M_dataplus._M_p;
        break;
      case Int32:
        array_03 = *(int **)(pcVar16->_M_value + 8);
        pIVar1 = local_430->m_Engine->m_IO;
        std::__cxx11::string::string((string *)&local_470,local_420,(allocator *)local_418);
        local_450._M_dataplus._M_p = (pointer)paVar18;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"");
        BaseData = local_428;
        local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_290,"/","");
        core::IO::DefineAttribute<int>(pIVar1,&local_470,array_03,sVar20,&local_450,&local_290,true)
        ;
        paVar12 = &local_290.field_2;
        _Var15._M_p = local_290._M_dataplus._M_p;
        break;
      case Int64:
        plVar7 = *(long **)(pcVar16->_M_value + 8);
        pIVar1 = local_430->m_Engine->m_IO;
        std::__cxx11::string::string((string *)&local_470,local_420,(allocator *)local_418);
        local_450._M_dataplus._M_p = (pointer)paVar18;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"");
        BaseData = local_428;
        local_2b0._M_dataplus._M_p = (pointer)&local_2b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b0,"/","");
        core::IO::DefineAttribute<long>(pIVar1,&local_470,plVar7,sVar20,&local_450,&local_2b0,true);
        paVar12 = &local_2b0.field_2;
        _Var15._M_p = local_2b0._M_dataplus._M_p;
        break;
      case UInt8:
        array_01 = *(uchar **)(pcVar16->_M_value + 8);
        pIVar1 = local_430->m_Engine->m_IO;
        std::__cxx11::string::string((string *)&local_470,local_420,(allocator *)local_418);
        local_450._M_dataplus._M_p = (pointer)paVar18;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"");
        BaseData = local_428;
        local_2d0._M_dataplus._M_p = (pointer)&local_2d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2d0,"/","");
        core::IO::DefineAttribute<unsigned_char>
                  (pIVar1,&local_470,array_01,sVar20,&local_450,&local_2d0,true);
        paVar12 = &local_2d0.field_2;
        _Var15._M_p = local_2d0._M_dataplus._M_p;
        break;
      case UInt16:
        array_06 = *(unsigned_short **)(pcVar16->_M_value + 8);
        pIVar1 = local_430->m_Engine->m_IO;
        std::__cxx11::string::string((string *)&local_470,local_420,(allocator *)local_418);
        local_450._M_dataplus._M_p = (pointer)paVar18;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"");
        BaseData = local_428;
        local_2f0._M_dataplus._M_p = (pointer)&local_2f0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_2f0,"/","");
        core::IO::DefineAttribute<unsigned_short>
                  (pIVar1,&local_470,array_06,sVar20,&local_450,&local_2f0,true);
        paVar12 = &local_2f0.field_2;
        _Var15._M_p = local_2f0._M_dataplus._M_p;
        break;
      case UInt32:
        array_07 = *(uint **)(pcVar16->_M_value + 8);
        pIVar1 = local_430->m_Engine->m_IO;
        std::__cxx11::string::string((string *)&local_470,local_420,(allocator *)local_418);
        local_450._M_dataplus._M_p = (pointer)paVar18;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"");
        BaseData = local_428;
        local_310._M_dataplus._M_p = (pointer)&local_310.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_310,"/","");
        core::IO::DefineAttribute<unsigned_int>
                  (pIVar1,&local_470,array_07,sVar20,&local_450,&local_310,true);
        paVar12 = &local_310.field_2;
        _Var15._M_p = local_310._M_dataplus._M_p;
        break;
      case UInt64:
        array_04 = *(unsigned_long **)(pcVar16->_M_value + 8);
        pIVar1 = local_430->m_Engine->m_IO;
        std::__cxx11::string::string((string *)&local_470,local_420,(allocator *)local_418);
        local_450._M_dataplus._M_p = (pointer)paVar18;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"");
        BaseData = local_428;
        local_330._M_dataplus._M_p = (pointer)&local_330.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_330,"/","");
        core::IO::DefineAttribute<unsigned_long>
                  (pIVar1,&local_470,array_04,sVar20,&local_450,&local_330,true);
        paVar12 = &local_330.field_2;
        _Var15._M_p = local_330._M_dataplus._M_p;
        break;
      case Float:
        array_09 = *(float **)(pcVar16->_M_value + 8);
        pIVar1 = local_430->m_Engine->m_IO;
        std::__cxx11::string::string((string *)&local_470,local_420,(allocator *)local_418);
        local_450._M_dataplus._M_p = (pointer)paVar18;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"");
        BaseData = local_428;
        local_350._M_dataplus._M_p = (pointer)&local_350.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_350,"/","");
        core::IO::DefineAttribute<float>
                  (pIVar1,&local_470,array_09,sVar20,&local_450,&local_350,true);
        paVar12 = &local_350.field_2;
        _Var15._M_p = local_350._M_dataplus._M_p;
        break;
      case Double:
        array_02 = *(double **)(pcVar16->_M_value + 8);
        pIVar1 = local_430->m_Engine->m_IO;
        std::__cxx11::string::string((string *)&local_470,local_420,(allocator *)local_418);
        local_450._M_dataplus._M_p = (pointer)paVar18;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"");
        BaseData = local_428;
        local_370._M_dataplus._M_p = (pointer)&local_370.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_370,"/","");
        core::IO::DefineAttribute<double>
                  (pIVar1,&local_470,array_02,sVar20,&local_450,&local_370,true);
        paVar12 = &local_370.field_2;
        _Var15._M_p = local_370._M_dataplus._M_p;
        break;
      case LongDouble:
        array_08 = *(longdouble **)(pcVar16->_M_value + 8);
        pIVar1 = local_430->m_Engine->m_IO;
        std::__cxx11::string::string((string *)&local_470,local_420,(allocator *)local_418);
        local_450._M_dataplus._M_p = (pointer)paVar18;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"");
        BaseData = local_428;
        local_390._M_dataplus._M_p = (pointer)&local_390.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_390,"/","");
        core::IO::DefineAttribute<long_double>
                  (pIVar1,&local_470,array_08,sVar20,&local_450,&local_390,true);
        paVar12 = &local_390.field_2;
        _Var15._M_p = local_390._M_dataplus._M_p;
        break;
      case FloatComplex:
        array_00 = *(complex<float> **)(pcVar16->_M_value + 8);
        pIVar1 = local_430->m_Engine->m_IO;
        std::__cxx11::string::string((string *)&local_470,local_420,(allocator *)local_418);
        local_450._M_dataplus._M_p = (pointer)paVar18;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"");
        BaseData = local_428;
        local_3b0._M_dataplus._M_p = (pointer)&local_3b0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3b0,"/","");
        core::IO::DefineAttribute<std::complex<float>>
                  (pIVar1,&local_470,array_00,sVar20,&local_450,&local_3b0,true);
        paVar12 = &local_3b0.field_2;
        _Var15._M_p = local_3b0._M_dataplus._M_p;
        break;
      case DoubleComplex:
        pcVar16 = *(complex<double> **)(pcVar16->_M_value + 8);
        pIVar1 = local_430->m_Engine->m_IO;
        std::__cxx11::string::string((string *)&local_470,local_420,(allocator *)local_418);
        local_450._M_dataplus._M_p = (pointer)paVar18;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"");
        BaseData = local_428;
        local_3d0._M_dataplus._M_p = (pointer)&local_3d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_3d0,"/","");
        core::IO::DefineAttribute<std::complex<double>>
                  (pIVar1,&local_470,pcVar16,sVar20,&local_450,&local_3d0,true);
        paVar12 = &local_3d0.field_2;
        _Var15._M_p = local_3d0._M_dataplus._M_p;
        break;
      case String:
        local_418._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_418._8_8_ = (pointer)0x0;
        local_418._16_8_ = 0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::resize((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_418,sVar20);
        local_3e0 = sVar20;
        if (sVar20 != 0) {
          lVar6 = *(long *)(pcVar16->_M_value + 8);
          lVar19 = 0;
          sVar20 = 0;
          do {
            pcVar9 = *(char **)(lVar6 + sVar20 * 8);
            pcVar14 = *(char **)(local_418._0_8_ + lVar19 + 8);
            pcVar17 = (pointer)(local_418._0_8_ + lVar19);
            strlen(pcVar9);
            std::__cxx11::string::_M_replace((ulong)pcVar17,0,pcVar14,(ulong)pcVar9);
            sVar20 = sVar20 + 1;
            lVar19 = lVar19 + 0x20;
          } while (local_3e0 != sVar20);
        }
        pIVar1 = local_430->m_Engine->m_IO;
        std::__cxx11::string::string((string *)&local_470,local_420,(allocator *)&local_3f4);
        uVar2 = local_418._8_8_;
        uVar5 = local_418._0_8_;
        local_450._M_dataplus._M_p = (pointer)&local_450.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_450,"");
        BaseData = local_428;
        local_230._M_dataplus._M_p = (pointer)&local_230.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_230,"/","");
        core::IO::DefineAttribute<std::__cxx11::string>
                  (pIVar1,&local_470,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)uVar5,
                   (long)(uVar2 - uVar5) >> 5,&local_450,&local_230,true);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_450._M_dataplus._M_p != &local_450.field_2) {
          operator_delete(local_450._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_470._M_dataplus._M_p != &local_470.field_2) {
          operator_delete(local_470._M_dataplus._M_p);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_418);
        goto LAB_00611441;
      default:
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Loading attribute matched no type ",0x22);
        ToString_abi_cxx11_(&local_470,(adios2 *)(ulong)DVar4,type_00);
        poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cout,local_470._M_dataplus._M_p,
                             local_470._M_string_length);
        std::endl<char,std::char_traits<char>>(poVar10);
        BaseData = local_428;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_470._M_dataplus._M_p != &local_470.field_2) {
          operator_delete(local_470._M_dataplus._M_p);
        }
        goto LAB_00611441;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Var15._M_p != paVar12) {
        operator_delete(_Var15._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_450._M_dataplus._M_p != paVar18) {
        operator_delete(local_450._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_470._M_dataplus._M_p != &local_470.field_2) {
        operator_delete(local_470._M_dataplus._M_p);
      }
LAB_00611441:
      free(local_420);
      uVar13 = (int)local_3e8 + 2;
LAB_00611456:
      local_3e8 = (ulong)uVar13;
      plVar7 = local_3f0 + (long)(int)uVar13 * 3;
      pcVar9 = (char *)*plVar7;
    } while (pcVar9 != (char *)0x0);
  }
switchD_00610010_caseD_10:
  return;
}

Assistant:

void BP5Deserializer::InstallAttributesV1(FFSTypeHandle FFSformat, void *BaseData, size_t Step)
{
    FMFieldList FieldList;
    FMStructDescList FormatList;

    if (Step != m_LastAttrStep)
    {
        m_Engine->m_IO.RemoveAllAttributes();
        m_LastAttrStep = Step;
    }
    FormatList = format_list_of_FMFormat(FMFormat_of_original(FFSformat));
    FieldList = FormatList[0].field_list;
    int i = 0;
    while (FieldList[i].field_name)
    {
        void *field_data = (char *)BaseData + FieldList[i].field_offset;

        if (!NameIndicatesAttrArray(FieldList[i].field_name))
        {
            DataType Type;
            int ElemSize;
            const char *FieldName = BreakdownVarName(FieldList[i].field_name, &Type, &ElemSize);
            if (Type == adios2::DataType::Struct)
            {
                return;
            }
            else if (Type == helper::GetDataType<std::string>())
            {
                m_Engine->m_IO.DefineAttribute<std::string>(FieldName, *(char **)field_data, "",
                                                            "/", true);
            }
#define declare_type(T)                                                                            \
    else if (Type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        m_Engine->m_IO.DefineAttribute<T>(FieldName, *(T *)field_data, "", "/", true);             \
    }

            ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(declare_type)
#undef declare_type
            else
            {
                std::cout << "Loading attribute matched no type " << ToString(Type) << std::endl;
            }
            i++;
        }
        else
        {
            DataType Type;
            size_t ElemCount = *(size_t *)field_data;
            field_data = (void *)((char *)field_data + sizeof(size_t));
            i++;
            char *FieldName = strdup(FieldList[i].field_name + 4); // skip BP5_
            char *FieldType = strdup(FieldList[i].field_type);
            *strchr(FieldType, '[') = 0;
            Type = (DataType)TranslateFFSType2ADIOS(FieldType, FieldList[i].field_size);
            if (Type == adios2::DataType::Struct)
            {
                return;
            }
            else if (Type == helper::GetDataType<std::string>())
            {
                std::vector<std::string> array;
                array.resize(ElemCount);
                char **str_array = *(char ***)field_data;
                for (size_t i = 0; i < ElemCount; i++)
                {
                    array[i].assign(str_array[i]);
                }
                m_Engine->m_IO.DefineAttribute<std::string>(FieldName, array.data(), array.size(),
                                                            "", "/", true);
            }
#define declare_type(T)                                                                            \
    else if (Type == helper::GetDataType<T>())                                                     \
    {                                                                                              \
        T **array = *(T ***)field_data;                                                            \
        m_Engine->m_IO.DefineAttribute<T>(FieldName, (T *)array, ElemCount, "", "/", true);        \
    }

            ADIOS2_FOREACH_PRIMITIVE_STDTYPE_1ARG(declare_type)
#undef declare_type
            else
            {
                std::cout << "Loading attribute matched no type " << ToString(Type) << std::endl;
            }